

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# day23.cpp
# Opt level: O0

int64_t __thiscall anon_unknown.dwarf_993b5::Region::solve_distance(Region *this)

{
  reference pvVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  void *in_RDI;
  long slack_1;
  long slack;
  int64_t step;
  int i_1;
  int64_t candidates;
  value_type *r_1;
  iterator __end2;
  iterator __begin2;
  array<std::pair<long,_long>,_4UL> *__range2;
  int64_t dist;
  int64_t delta;
  long sum;
  value_type *r;
  int i;
  array<std::pair<long,_long>,_4UL> H;
  size_type in_stack_fffffffffffffed8;
  array<std::pair<long,_long>,_4UL> *in_stack_fffffffffffffee0;
  long local_d0;
  long local_c8;
  long local_c0;
  array<std::pair<long,_long>,_4UL> *local_b8;
  int local_ac;
  long local_a8;
  long local_a0;
  iterator local_98;
  iterator local_90;
  iterator local_88;
  undefined1 *local_80;
  long local_78;
  long local_70;
  long local_68;
  reference local_60;
  int local_54;
  undefined1 local_50 [80];
  
  memcpy(local_50,in_RDI,0x40);
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    local_60 = std::array<std::pair<long,_long>,_4UL>::operator[]
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    lVar4 = local_60->second;
    if (lVar4 < 1) {
      lVar4 = -lVar4;
    }
    lVar2 = local_60->first;
    if (lVar2 < 1) {
      lVar2 = -lVar2;
    }
    if (lVar4 < lVar2) {
      std::swap<long>(&local_60->first,&local_60->second);
    }
  }
  pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  lVar4 = pvVar1->first;
  pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  lVar2 = pvVar1->first;
  pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  lVar2 = lVar4 + lVar2 + pvVar1->first;
  local_70 = 0;
  local_68 = lVar2;
  pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                     (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  lVar4 = local_68;
  if (lVar2 < pvVar1->first) {
    pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    local_70 = pvVar1->first - local_68;
  }
  else {
    pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                       (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    lVar2 = local_68;
    if (pvVar1->second < lVar4) {
      pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      local_70 = pvVar1->second - local_68;
      pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      lVar4 = pvVar1->second;
      pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pvVar1->first = lVar4;
    }
    else {
      pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                         (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      pvVar1->first = lVar2;
    }
  }
  local_78 = 0;
  local_80 = local_50;
  local_88 = std::array<std::pair<long,_long>,_4UL>::begin
                       ((array<std::pair<long,_long>,_4UL> *)0x14783a);
  local_90 = std::array<std::pair<long,_long>,_4UL>::end
                       ((array<std::pair<long,_long>,_4UL> *)0x14784f);
  for (; local_88 != local_90; local_88 = local_88 + 1) {
    local_98 = local_88;
    local_a0 = local_88->first;
    if (local_a0 < 1) {
      local_a0 = -local_a0;
    }
    plVar3 = std::max<long>(&local_78,&local_a0);
    local_78 = *plVar3;
  }
  do {
    if (local_70 == 0) {
      return local_78;
    }
    local_a8 = 0;
    for (local_ac = 0; local_ac < 3; local_ac = local_ac + 1) {
      local_b8 = (array<std::pair<long,_long>,_4UL> *)0x0;
      if (local_70 < 1) {
        pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if (pvVar1->second < 0) {
          local_d0 = -local_78;
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          plVar3 = std::max<long>(&local_d0,&pvVar1->second);
          lVar4 = *plVar3;
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          local_c8 = lVar4 - pvVar1->first;
          plVar3 = std::max<long>(&local_c8,&local_70);
          local_b8 = (array<std::pair<long,_long>,_4UL> *)*plVar3;
          goto LAB_00147a35;
        }
      }
      else {
        pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                           (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        if (0 < pvVar1->second) {
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          plVar3 = std::min<long>(&local_78,&pvVar1->second);
          lVar4 = *plVar3;
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          local_c0 = lVar4 - pvVar1->first;
          plVar3 = std::min<long>(&local_c0,&local_70);
          local_b8 = (array<std::pair<long,_long>,_4UL> *)*plVar3;
LAB_00147a35:
          in_stack_fffffffffffffee0 = local_b8;
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (local_b8,in_stack_fffffffffffffed8);
          pvVar1->first = (long)&in_stack_fffffffffffffee0->_M_elems[0].first + pvVar1->first;
          local_70 = local_70 - (long)local_b8;
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          lVar4 = pvVar1->first;
          pvVar1 = std::array<std::pair<long,_long>,_4UL>::operator[]
                             (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
          if (lVar4 != pvVar1->second) {
            local_a8 = local_a8 + 1;
          }
        }
      }
    }
    if (local_70 != 0) {
      if (local_a8 == 0) {
        return 0x7fffffffffffffff;
      }
      lVar4 = local_70;
      if (local_70 < 1) {
        lVar4 = -local_70;
      }
      local_78 = ((lVar4 / 2 + local_a8 + -1) / local_a8) * 2 + local_78;
    }
  } while( true );
}

Assistant:

int64_t solve_distance() const {
		auto H = R;

		// Put ranges R[0..2] in absolute value order
		for (int i = 0; i < 3; i++) {
			auto& r = H[i];
			if (labs(r.second) < labs(r.first)) {
				std::swap(r.first, r.second);
			}
		}

		// Get initial value for the sum (N0 + N1 + N2)
		auto sum = H[0].first + H[1].first + H[2].first;
		int64_t delta = 0;
		if (sum < H[3].first) {
			delta = H[3].first - sum;  // Too low
		} else if (sum > H[3].second) {
			delta = H[3].second - sum; // Too high
			H[3].first = H[3].second;
		} else {
			H[3].first = sum;          // Just right
		}

		// Get initial distance to origin
		int64_t dist = 0;
		for (auto&& r : H) {
			dist = std::max(dist, labs(r.first));
		}

		while (delta) {
			int64_t candidates = 0;
			for (int i = 0; i < 3; i++) {
				// Adjust H[0..2] as far as possible without affecting
				// distance to origin
				int64_t step = 0;
				if (delta > 0) {
					if (H[i].second <= 0) continue; // wrong direction
					auto slack = std::min( dist, H[i].second) - H[i].first;
					step = std::min(slack, delta);
				} else {
					if (H[i].second >= 0) continue; // wrong direction
					auto slack = std::max(-dist, H[i].second) - H[i].first;
					step = std::max(slack, delta);
				}
				H[i].first += step;
				delta -= step;
				// Keep track of how many variables still have adjustment room
				if (H[i].first != H[i].second) {
					candidates++;
				}
			}
			if (delta) {
				if (!candidates) {
					// No solution
					return INT64_MAX;
				}
				/* Increase distance-to-origin by the minimum amount which
				 * would satisfy the remaining delta, assuming all candidates
				 * have sufficient slack.  (This may underestimate, in which
				 * case it will loop again with a smaller candidate count.)
				 * Distance must be raised in even increments.
				 */
				dist += (((labs(delta) / 2) + (candidates - 1)) / candidates) * 2;
			}
		}

		return dist;
	}